

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::WriteFieldDocComment
          (java *this,Printer *printer,FieldDescriptor *field,Options *options,bool kdoc)

{
  Options *pOVar1;
  FieldDescriptor *pFVar2;
  string_view local_f8;
  Options local_e8;
  undefined1 local_88 [80];
  string_view local_38;
  byte local_21;
  FieldDescriptor *pFStack_20;
  bool kdoc_local;
  Options *options_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  local_21 = (byte)options & 1;
  pFStack_20 = field;
  options_local = (Options *)printer;
  field_local = (FieldDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"/**\n");
  protobuf::io::Printer::Print<>((Printer *)this,local_38);
  pFVar2 = field_local;
  pOVar1 = options_local;
  Options::Options((Options *)local_88,(Options *)field);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>
            ((java *)pFVar2,(Printer *)pOVar1,(FieldDescriptor *)local_88,
             (Options *)(ulong)(local_21 & 1),kdoc);
  Options::~Options((Options *)local_88);
  pFVar2 = field_local;
  pOVar1 = options_local;
  Options::Options(&local_e8,(Options *)field);
  WriteDebugString((Printer *)pFVar2,(FieldDescriptor *)pOVar1,&local_e8,(bool)(local_21 & 1));
  Options::~Options(&local_e8);
  pFVar2 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8," */\n");
  protobuf::io::Printer::Print<>((Printer *)pFVar2,local_f8);
  return;
}

Assistant:

void WriteFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                          const Options options, const bool kdoc) {
  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then continue with the field declaration,
  // e.g.:
  //   optional string foo = 5;
  // And then we end with the javadoc tags if applicable.
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  printer->Print(" */\n");
}